

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_35::InMemoryFile::copy(InMemoryFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  Clock *pCVar2;
  long lVar3;
  long lVar4;
  ulong in_RCX;
  ulong uVar5;
  ulong in_R8;
  EVP_PKEY_CTX *pEVar6;
  undefined1 local_60 [8];
  ulong local_58;
  
  (**(code **)(*(long *)src + 0x10))(local_60);
  uVar5 = local_58 - in_RCX;
  if (in_RCX <= local_58 && uVar5 != 0) {
    if (in_R8 < uVar5) {
      uVar5 = in_R8;
    }
    if (uVar5 != 0) {
      _::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
      Impl::ensureCapacity(&(this->impl).value,(size_t)(dst + uVar5));
      lVar3 = (**(code **)(*(long *)src + 0x30))(src);
      pEVar1 = (EVP_PKEY_CTX *)(this->impl).value.size;
      pEVar6 = dst + lVar3;
      if (dst + lVar3 < pEVar1) {
        pEVar6 = pEVar1;
      }
      pCVar2 = (this->impl).value.clock;
      (this->impl).value.size = (size_t)pEVar6;
      lVar4 = (*(code *)**(undefined8 **)pCVar2)();
      (this->impl).value.lastModified.value.value = lVar4;
      _::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
      goto LAB_00212aa4;
    }
  }
  lVar3 = 0;
LAB_00212aa4:
  return (int)lVar3;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t copySize) const override {
    size_t fromFileSize = from.stat().size;
    if (fromFileSize <= fromOffset) return 0;

    // Clamp size to EOF.
    copySize = kj::min(copySize, fromFileSize - fromOffset);
    if (copySize == 0) return 0;

    auto lock = impl.lockExclusive();

    // Allocate space for the copy.
    uint64_t end = offset + copySize;
    lock->ensureCapacity(end);

    // Read directly into our backing store.
    size_t n = from.read(fromOffset, lock->bytes.slice(offset, end));
    lock->size = kj::max(lock->size, offset + n);

    lock->modified();
    return n;
  }